

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3GetVarint(char *pBuf,sqlite_int64 *v)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  u64 c;
  ulong uStack_40;
  int shift;
  u64 b;
  u32 a;
  uchar *pStart;
  uchar *p;
  sqlite_int64 *v_local;
  char *pBuf_local;
  
  bVar1 = *pBuf;
  if ((bVar1 & 0x80) == 0) {
    *v = (ulong)(uint)bVar1;
    pBuf_local._4_4_ = 1;
  }
  else {
    uVar2 = bVar1 & 0x7f;
    uVar3 = (uint)(byte)pBuf[1] << 7;
    if ((uVar3 & 0x4000) == 0) {
      *v = (ulong)(uVar2 | uVar3);
      pBuf_local._4_4_ = 2;
    }
    else {
      uVar2 = uVar2 | uVar3 & 0x3fff;
      uVar3 = (uint)(byte)pBuf[2] << 0xe;
      if ((uVar3 & 0x200000) == 0) {
        *v = (ulong)(uVar2 | uVar3);
        pBuf_local._4_4_ = 3;
      }
      else {
        uVar2 = uVar2 | uVar3 & 0x1fffff;
        uVar3 = (uint)(byte)pBuf[3] << 0x15;
        if ((uVar3 & 0x10000000) == 0) {
          *v = (ulong)(uVar2 | uVar3);
          pBuf_local._4_4_ = 4;
        }
        else {
          uStack_40 = (ulong)(uVar2 | uVar3 & 0xfffffff);
          pStart = (uchar *)(pBuf + 4);
          for (c._4_4_ = 0x1c; c._4_4_ < 0x40; c._4_4_ = c._4_4_ + 7) {
            puVar4 = pStart + 1;
            bVar1 = *pStart;
            uStack_40 = (((ulong)bVar1 & 0x7f) << ((byte)c._4_4_ & 0x3f)) + uStack_40;
            pStart = puVar4;
            if ((bVar1 & 0x80) == 0) break;
          }
          *v = uStack_40;
          pBuf_local._4_4_ = (int)pStart - (int)pBuf;
        }
      }
    }
  }
  return pBuf_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint(const char *pBuf, sqlite_int64 *v){
  const unsigned char *p = (const unsigned char*)pBuf;
  const unsigned char *pStart = p;
  u32 a;
  u64 b;
  int shift;

  GETVARINT_INIT(a, p, 0,  0x00,     0x80, *v, 1);
  GETVARINT_STEP(a, p, 7,  0x7F,     0x4000, *v, 2);
  GETVARINT_STEP(a, p, 14, 0x3FFF,   0x200000, *v, 3);
  GETVARINT_STEP(a, p, 21, 0x1FFFFF, 0x10000000, *v, 4);
  b = (a & 0x0FFFFFFF );

  for(shift=28; shift<=63; shift+=7){
    u64 c = *p++;
    b += (c&0x7F) << shift;
    if( (c & 0x80)==0 ) break;
  }
  *v = b;
  return (int)(p - pStart);
}